

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

bool __thiscall toml::internal::Parser::parseInlineTable(Parser *this,Value *value)

{
  bool bVar1;
  undefined1 uVar2;
  TokenType TVar3;
  Token *pTVar4;
  Parser *in_RDI;
  Value v;
  string key;
  bool first;
  string *in_stack_000000c8;
  Parser *in_stack_000000d0;
  Value t;
  string *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef4;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  Parser *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  Value *this_00;
  string local_e0 [16];
  Parser *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  Value local_c0;
  string local_b0 [32];
  int local_90;
  allocator local_89;
  string local_88 [24];
  Value *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 local_58 [24];
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  byte local_1;
  
  bVar1 = consumeForKey(in_stack_fffffffffffffef8,
                        CONCAT13(in_stack_fffffffffffffef7,
                                 CONCAT12(in_stack_fffffffffffffef6,
                                          CONCAT11(in_stack_fffffffffffffef5,
                                                   in_stack_fffffffffffffef4))));
  if (bVar1) {
    local_38 = 0;
    uStack_30 = 0;
    local_58._16_8_ = 0;
    uStack_40 = 0;
    local_58._0_8_ = 0;
    local_58._8_8_ = (void *)0x0;
    this_00 = (Value *)local_58;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
           *)0x236c6c);
    Value::Value((Value *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 (Table *)in_stack_fffffffffffffef8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::Value>_>_>
            *)0x236c8d);
    uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff98);
    do {
      pTVar4 = token(in_RDI);
      TVar3 = Token::type(pTVar4);
      if (TVar3 == RBRACE) {
        bVar1 = consumeForValue(in_stack_fffffffffffffef8,
                                CONCAT13(in_stack_fffffffffffffef7,
                                         CONCAT12(in_stack_fffffffffffffef6,
                                                  CONCAT11(in_stack_fffffffffffffef5,
                                                           in_stack_fffffffffffffef4))));
        if (bVar1) {
          Value::operator=((Value *)in_stack_fffffffffffffef8,
                           (Value *)CONCAT17(in_stack_fffffffffffffef7,
                                             CONCAT16(in_stack_fffffffffffffef6,
                                                      CONCAT15(in_stack_fffffffffffffef5,
                                                               CONCAT14(bVar1,
                                                  in_stack_fffffffffffffef0)))));
          local_1 = 1;
          local_90 = 1;
        }
        else {
          local_1 = 0;
          local_90 = 1;
        }
        break;
      }
      if ((uVar5 & 0x1000000) == 0) {
        pTVar4 = token(in_RDI);
        TVar3 = Token::type(pTVar4);
        if (TVar3 != COMMA) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_88,"inline table didn\'t have \',\' for delimiter?",&local_89);
          addError(in_stack_000000d0,in_stack_000000c8);
          std::__cxx11::string::~string(local_88);
          std::allocator<char>::~allocator((allocator<char> *)&local_89);
          local_1 = 0;
          local_90 = 1;
          break;
        }
        nextKey(in_stack_ffffffffffffff30);
      }
      uVar5 = uVar5 & 0xffffff;
      in_stack_fffffffffffffef8 = (Parser *)local_b0;
      std::__cxx11::string::string((string *)in_stack_fffffffffffffef8);
      uVar2 = parseKey(in_stack_fffffffffffffef8,
                       (string *)
                       CONCAT17(in_stack_fffffffffffffef7,
                                CONCAT16(in_stack_fffffffffffffef6,
                                         CONCAT15(in_stack_fffffffffffffef5,
                                                  CONCAT14(in_stack_fffffffffffffef4,
                                                           in_stack_fffffffffffffef0)))));
      if ((bool)uVar2) {
        in_stack_fffffffffffffef7 =
             consumeForValue(in_stack_fffffffffffffef8,
                             CONCAT13(in_stack_fffffffffffffef7,
                                      CONCAT12(in_stack_fffffffffffffef6,
                                               CONCAT11(in_stack_fffffffffffffef5,
                                                        in_stack_fffffffffffffef4))));
        if ((bool)in_stack_fffffffffffffef7) {
          Value::Value(&local_c0);
          in_stack_fffffffffffffef6 =
               parseValue((Parser *)CONCAT44(in_stack_ffffffffffffff9c,uVar5),
                          in_stack_ffffffffffffff90);
          if ((bool)in_stack_fffffffffffffef6) {
            in_stack_fffffffffffffef5 =
                 Value::has((Value *)CONCAT17(in_stack_fffffffffffffef7,
                                              CONCAT16(in_stack_fffffffffffffef6,
                                                       CONCAT15(in_stack_fffffffffffffef5,
                                                                CONCAT14(in_stack_fffffffffffffef4,
                                                                         in_stack_fffffffffffffef0))
                                                      )),in_stack_fffffffffffffee8);
            if ((bool)in_stack_fffffffffffffef5) {
              std::operator+(in_stack_ffffffffffffff38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffff30);
              addError(in_stack_000000d0,in_stack_000000c8);
              std::__cxx11::string::~string(local_e0);
              local_1 = 0;
              local_90 = 1;
            }
            else {
              Value::set((Value *)CONCAT17(uVar2,in_stack_ffffffffffffff00),
                         (string *)in_stack_fffffffffffffef8,
                         (Value *)CONCAT17(in_stack_fffffffffffffef7,
                                           CONCAT16(in_stack_fffffffffffffef6,
                                                    CONCAT15(in_stack_fffffffffffffef5,
                                                             CONCAT14(in_stack_fffffffffffffef4,
                                                                      in_stack_fffffffffffffef0)))))
              ;
              local_90 = 0;
            }
          }
          else {
            local_1 = 0;
            local_90 = 1;
          }
          Value::~Value(this_00);
        }
        else {
          local_1 = 0;
          local_90 = 1;
        }
      }
      else {
        local_1 = 0;
        local_90 = 1;
      }
      std::__cxx11::string::~string(local_b0);
    } while (local_90 == 0);
    Value::~Value(this_00);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Parser::parseInlineTable(Value* value)
{
    // For inline table, next is KEY, so use consumeForKey here.
    if (!consumeForKey(TokenType::LBRACE))
        return false;

    Value t((Table()));
    bool first = true;
    while (true) {
        if (token().type() == TokenType::RBRACE) {
            break;
        }

        if (!first) {
            if (token().type() != TokenType::COMMA) {
                addError("inline table didn't have ',' for delimiter?");
                return false;
            }
            nextKey();
        }
        first = false;

        std::string key;
        if (!parseKey(&key))
            return false;
        if (!consumeForValue(TokenType::EQUAL))
            return false;
        Value v;
        if (!parseValue(&v))
            return false;

        if (t.has(key)) {
            addError("inline table has multiple same keys: key=" + key);
            return false;
        }

        t.set(key, v);
    }

    if (!consumeForValue(TokenType::RBRACE))
        return false;
    *value = std::move(t);
    return true;
}